

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O1

void __thiscall cppcms::impl::service::service(service *this)

{
  (this->forwarder_)._M_t.
  super___uniq_ptr_impl<cppcms::forwarder,_std::default_delete<cppcms::forwarder>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::forwarder_*,_std::default_delete<cppcms::forwarder>_>.
  super__Head_base<0UL,_cppcms::forwarder_*,_false>._M_head_impl = (forwarder *)0x0;
  (this->cached_settings_)._M_t.
  super___uniq_ptr_impl<cppcms::impl::cached_settings,_std::default_delete<cppcms::impl::cached_settings>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::cached_settings_*,_std::default_delete<cppcms::impl::cached_settings>_>
  .super__Head_base<0UL,_cppcms::impl::cached_settings_*,_false>._M_head_impl =
       (cached_settings *)0x0;
  (this->cache_pool_)._M_t.
  super___uniq_ptr_impl<cppcms::cache_pool,_std::default_delete<cppcms::cache_pool>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::cache_pool_*,_std::default_delete<cppcms::cache_pool>_>.
  super__Head_base<0UL,_cppcms::cache_pool_*,_false>._M_head_impl = (cache_pool *)0x0;
  (this->session_pool_)._M_t.
  super___uniq_ptr_impl<cppcms::session_pool,_std::default_delete<cppcms::session_pool>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::session_pool_*,_std::default_delete<cppcms::session_pool>_>.
  super__Head_base<0UL,_cppcms::session_pool_*,_false>._M_head_impl = (session_pool *)0x0;
  (this->locale_generator_)._M_t.
  super___uniq_ptr_impl<booster::locale::generator,_std::default_delete<booster::locale::generator>_>
  ._M_t.
  super__Tuple_impl<0UL,_booster::locale::generator_*,_std::default_delete<booster::locale::generator>_>
  .super__Head_base<0UL,_booster::locale::generator_*,_false>._M_head_impl = (generator *)0x0;
  (this->views_pool_)._M_t.
  super___uniq_ptr_impl<cppcms::views::manager,_std::default_delete<cppcms::views::manager>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::views::manager_*,_std::default_delete<cppcms::views::manager>_>.
  super__Head_base<0UL,_cppcms::views::manager_*,_false>._M_head_impl = (manager *)0x0;
  (this->applications_pool_)._M_t.
  super___uniq_ptr_impl<cppcms::applications_pool,_std::default_delete<cppcms::applications_pool>_>.
  _M_t.
  super__Tuple_impl<0UL,_cppcms::applications_pool_*,_std::default_delete<cppcms::applications_pool>_>
  .super__Head_base<0UL,_cppcms::applications_pool_*,_false>._M_head_impl = (applications_pool *)0x0
  ;
  (this->thread_pool_)._M_t.
  super___uniq_ptr_impl<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::thread_pool_*,_std::default_delete<cppcms::thread_pool>_>.
  super__Head_base<0UL,_cppcms::thread_pool_*,_false>._M_head_impl = (thread_pool *)0x0;
  (this->prefork_acceptor_)._M_t.
  super___uniq_ptr_impl<cppcms::impl::prefork_acceptor,_std::default_delete<cppcms::impl::prefork_acceptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::prefork_acceptor_*,_std::default_delete<cppcms::impl::prefork_acceptor>_>
  .super__Head_base<0UL,_cppcms::impl::prefork_acceptor_*,_false>._M_head_impl =
       (prefork_acceptor *)0x0;
  (this->settings_)._M_t.
  super___uniq_ptr_impl<cppcms::json::value,_std::default_delete<cppcms::json::value>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::json::value_*,_std::default_delete<cppcms::json::value>_>.
  super__Head_base<0UL,_cppcms::json::value_*,_false>._M_head_impl = (value *)0x0;
  (this->acceptors_).
  super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->acceptors_).
  super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->io_service_)._M_t.
  super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>.
  _M_t.
  super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
  .super__Head_base<0UL,_booster::aio::io_service_*,_false>._M_head_impl = (io_service *)0x0;
  (this->acceptors_).
  super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::locale::locale(&this->default_locale_);
  (this->on_fork_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->on_fork_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->on_fork_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sig_)._M_t.
  super___uniq_ptr_impl<booster::aio::stream_socket,_std::default_delete<booster::aio::stream_socket>_>
  ._M_t.
  super__Tuple_impl<0UL,_booster::aio::stream_socket_*,_std::default_delete<booster::aio::stream_socket>_>
  .super__Head_base<0UL,_booster::aio::stream_socket_*,_false>._M_head_impl = (stream_socket *)0x0;
  (this->breaker_)._M_t.
  super___uniq_ptr_impl<booster::aio::stream_socket,_std::default_delete<booster::aio::stream_socket>_>
  ._M_t.
  super__Tuple_impl<0UL,_booster::aio::stream_socket_*,_std::default_delete<booster::aio::stream_socket>_>
  .super__Head_base<0UL,_booster::aio::stream_socket_*,_false>._M_head_impl = (stream_socket *)0x0;
  (this->args_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->plugins_).ptr_ = (scope *)0x0;
  return;
}

Assistant:

service::service() 
	{
	}